

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O0

value_type __thiscall Chromosome::del_gene(Chromosome *this,size_t chromno)

{
  reference pvVar1;
  __normal_iterator<std::bitset<50UL>_*,_std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>_>
  local_38;
  __normal_iterator<std::bitset<50UL>_*,_std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>_>
  local_30;
  const_iterator local_28;
  size_t local_20;
  size_t chromno_local;
  Chromosome *this_local;
  value_type ret;
  
  local_20 = chromno;
  chromno_local = (size_t)this;
  pvVar1 = std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>::operator[]
                     (&this->genes,chromno);
  this_local = (Chromosome *)(pvVar1->super__Base_bitset<1UL>)._M_w;
  local_38._M_current =
       (bitset<50UL> *)
       std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>::begin(&this->genes);
  local_30 = __gnu_cxx::
             __normal_iterator<std::bitset<50UL>_*,_std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>_>
             ::operator+(&local_38,local_20);
  __gnu_cxx::
  __normal_iterator<std::bitset<50ul>const*,std::vector<std::bitset<50ul>,std::allocator<std::bitset<50ul>>>>
  ::__normal_iterator<std::bitset<50ul>*>
            ((__normal_iterator<std::bitset<50ul>const*,std::vector<std::bitset<50ul>,std::allocator<std::bitset<50ul>>>>
              *)&local_28,&local_30);
  std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>::erase(&this->genes,local_28);
  return (value_type)(_Base_bitset<1UL>)this_local;
}

Assistant:

Chromosome::genes_t::value_type Chromosome::del_gene( size_t chromno )
{
	genes_t::value_type ret = genes[chromno];
	genes.erase(genes.begin() + chromno);

	return ret;
}